

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void initMain(void)

{
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  code *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  LOCK();
  g_isRunning._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  local_18 = 0x58ed;
  local_28 = 0x800000002;
  uStack_20 = 0x8000000080;
  GGSock::FileServer::init((Parameters *)&g_fileServer);
  local_48 = 0;
  uStack_40 = 0;
  local_30 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:552:35)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:552:35)>
             ::_M_manager;
  GGSock::Communicator::setErrorCallback((function *)&g_fileClient);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  local_48 = 0;
  uStack_40 = 0;
  local_30 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:560:79)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:560:79)>
             ::_M_manager;
  GGSock::Communicator::setMessageCallback(0x4220,(function *)0x65);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  local_48 = 0;
  uStack_40 = 0;
  local_30 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:579:79)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<unsigned_short_(const_char_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/examples/waver/common.cpp:579:79)>
             ::_M_manager;
  GGSock::Communicator::setMessageCallback(0x4220,(function *)0x67);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return;
}

Assistant:

void initMain() {
    g_isRunning = true;

    GGSock::FileServer::Parameters p;
#ifdef __EMSCRIPTEN__
    p.nWorkerThreads = 0;
#else
    p.nWorkerThreads = 2;
#endif
    g_fileServer.init(p);

    g_fileClient.setErrorCallback([](GGSock::Communicator::TErrorCode code) {
        printf("Disconnected with code = %d\n", code);

        g_hasReceivedFileInfos = false;
        g_hasRequestedFileInfos = false;
        g_hasReceivedFiles = false;
    });

    g_fileClient.setMessageCallback(GGSock::FileServer::MsgFileInfosResponse, [&](const char * dataBuffer, size_t dataSize) {
        printf("Received message %d, size = %d\n", GGSock::FileServer::MsgFileInfosResponse, (int) dataSize);

        size_t offset = 0;
        GGSock::Unserialize()(g_receivedFileInfos, dataBuffer, dataSize, offset);

        for (const auto & info : g_receivedFileInfos) {
            printf("    - %s : %s (size = %d, chunks = %d)\n", info.second.uri.c_str(), info.second.filename.c_str(), (int) info.second.filesize, (int) info.second.nChunks);
            g_receivedFiles[info.second.uri].info = info.second;
            g_receivedFiles[info.second.uri].data.resize(info.second.filesize);

            g_receivedFileInfosExtended[info.second.uri] = {};
        }

        g_hasReceivedFileInfos = true;

        return 0;
    });

    g_fileClient.setMessageCallback(GGSock::FileServer::MsgFileChunkResponse, [&](const char * dataBuffer, size_t dataSize) {
        GGSock::FileServer::FileChunkResponseData data;

        size_t offset = 0;
        GGSock::Unserialize()(data, dataBuffer, dataSize, offset);

        //printf("Received chunk %d for file '%s', size = %d\n", data.chunkId, data.uri.c_str(), (int) data.data.size());
        std::memcpy(g_receivedFiles[data.uri].data.data() + data.pStart, data.data.data(), data.pLen);

        g_receivedFileInfosExtended[data.uri].nReceivedChunks++;
        g_receivedFileInfosExtended[data.uri].nRequestedChunks--;
        g_receivedFileInfosExtended[data.uri].isChunkReceived[data.chunkId] = true;

        return 0;
    });
}